

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_usage(string *__return_storage_ptr__,Formatter *this,App *app,string *name)

{
  ostream *poVar1;
  string *delim;
  char *pcVar2;
  char *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  positional_names;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> positionals;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> non_pos_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream out;
  allocator<char> local_2f9;
  _Any_data local_2f8;
  code *local_2e8;
  code *local_2e0;
  _Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_2d8;
  _Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_2c0;
  _Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  string local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  string local_238;
  string local_218;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Usage",(allocator<char> *)&local_290);
  FormatterBase::get_label((string *)&local_2f8,&this->super_FormatterBase,&local_218);
  poVar1 = ::std::operator<<(local_1a8,(string *)local_2f8._M_pod_data);
  poVar1 = ::std::operator<<(poVar1,":");
  pcVar2 = "\n  ";
  if (name->_M_string_length == 0) {
    pcVar2 = "\n\n";
  }
  poVar1 = ::std::operator<<(poVar1,pcVar2 + 2);
  ::std::operator<<(poVar1,(string *)name);
  ::std::__cxx11::string::~string((string *)local_2f8._M_pod_data);
  ::std::__cxx11::string::~string((string *)&local_218);
  App::get_groups_abi_cxx11_(&local_290,app);
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  local_1c0 = std::
              _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/CLI11/CLI/Formatter.hpp:102:26)>
              ::_M_invoke;
  local_1c8 = std::
              _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/CLI11/CLI/Formatter.hpp:102:26)>
              ::_M_manager;
  App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)&local_2a8,
                   app,(function<bool_(const_CLI::Option_*)> *)&local_1d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
  if (local_2a8._M_impl.super__Vector_impl_data._M_start !=
      local_2a8._M_impl.super__Vector_impl_data._M_finish) {
    poVar1 = ::std::operator<<(local_1a8," [");
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"OPTIONS",(allocator<char> *)&local_2c0);
    FormatterBase::get_label((string *)&local_2f8,&this->super_FormatterBase,&local_238);
    poVar1 = ::std::operator<<(poVar1,(string *)local_2f8._M_pod_data);
    ::std::operator<<(poVar1,"]");
    ::std::__cxx11::string::~string((string *)local_2f8._M_pod_data);
    ::std::__cxx11::string::~string((string *)&local_238);
  }
  local_1f8._M_unused._M_object = (void *)0x0;
  local_1f8._8_8_ = 0;
  local_1e0 = std::
              _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/CLI11/CLI/Formatter.hpp:107:64)>
              ::_M_invoke;
  local_1e8 = std::
              _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/CLI11/CLI/Formatter.hpp:107:64)>
              ::_M_manager;
  App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)&local_2c0,
                   app,(function<bool_(const_CLI::Option_*)> *)&local_1f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1f8);
  if (local_2c0._M_impl.super__Vector_impl_data._M_start !=
      local_2c0._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2d8,
             (long)local_2c0._M_impl.super__Vector_impl_data._M_finish -
             (long)local_2c0._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)local_2f8._M_pod_data);
    delim = (string *)this;
    ::std::
    transform<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_3_>
              ((__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                )local_2c0._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                )local_2c0._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_2d8._M_impl.super__Vector_impl_data._M_start,(anon_class_8_1_8991fb9c)this);
    poVar1 = ::std::operator<<(local_1a8," ");
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_258," ",&local_2f9);
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)&local_2f8,(detail *)&local_2d8,&local_258,delim);
    ::std::operator<<(poVar1,(string *)local_2f8._M_pod_data);
    ::std::__cxx11::string::~string((string *)local_2f8._M_pod_data);
    ::std::__cxx11::string::~string((string *)&local_258);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2d8);
  }
  local_2f8._M_unused._M_object = (void *)0x0;
  local_2f8._8_8_ = 0;
  local_2e0 = std::
              _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/CLI11/CLI/Formatter.hpp:122:16)>
              ::_M_invoke;
  local_2e8 = std::
              _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/CLI11/CLI/Formatter.hpp:122:16)>
              ::_M_manager;
  App::get_subcommands
            ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)&local_2d8,app,
             (function<bool_(const_CLI::App_*)> *)&local_2f8);
  std::_Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~_Vector_base(&local_2d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_2f8);
  if (local_2d8._M_impl.super__Vector_impl_data._M_start !=
      local_2d8._M_impl.super__Vector_impl_data._M_finish) {
    poVar1 = ::std::operator<<(local_1a8," ");
    pcVar3 = "";
    pcVar2 = "[";
    if (app->require_subcommand_min_ != 0) {
      pcVar2 = "";
    }
    poVar1 = ::std::operator<<(poVar1,pcVar2);
    if (app->require_subcommand_max_ < 2) {
      pcVar2 = "SUBCOMMAND";
    }
    else {
      pcVar2 = "SUBCOMMANDS";
      if (1 < app->require_subcommand_min_) {
        pcVar2 = "SUBCOMMAND";
      }
    }
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,pcVar2,(allocator<char> *)&local_2d8);
    FormatterBase::get_label((string *)&local_2f8,&this->super_FormatterBase,&local_278);
    poVar1 = ::std::operator<<(poVar1,(string *)local_2f8._M_pod_data);
    if (app->require_subcommand_min_ == 0) {
      pcVar3 = "]";
    }
    ::std::operator<<(poVar1,pcVar3);
    ::std::__cxx11::string::~string((string *)local_2f8._M_pod_data);
    ::std::__cxx11::string::~string((string *)&local_278);
  }
  ::std::endl<char,std::char_traits<char>>(local_1a8);
  ::std::__cxx11::stringbuf::str();
  std::_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~_Vector_base
            (&local_2c0);
  std::_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~_Vector_base
            (&local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_290);
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_usage(const App *app, std::string name) const {
    std::stringstream out;

    out << get_label("Usage") << ":" << (name.empty() ? "" : " ") << name;

    std::vector<std::string> groups = app->get_groups();

    // Print an Options badge if any options exist
    std::vector<const Option *> non_pos_options =
        app->get_options([](const Option *opt) { return opt->nonpositional(); });
    if(!non_pos_options.empty())
        out << " [" << get_label("OPTIONS") << "]";

    // Positionals need to be listed here
    std::vector<const Option *> positionals = app->get_options([](const Option *opt) { return opt->get_positional(); });

    // Print out positionals if any are left
    if(!positionals.empty()) {
        // Convert to help names
        std::vector<std::string> positional_names(positionals.size());
        std::transform(positionals.begin(), positionals.end(), positional_names.begin(), [this](const Option *opt) {
            return make_option_usage(opt);
        });

        out << " " << detail::join(positional_names, " ");
    }

    // Add a marker if subcommands are expected or optional
    if(!app->get_subcommands(
               [](const CLI::App *subc) { return ((!subc->get_disabled()) && (!subc->get_name().empty())); })
            .empty()) {
        out << " " << (app->get_require_subcommand_min() == 0 ? "[" : "")
            << get_label(app->get_require_subcommand_max() < 2 || app->get_require_subcommand_min() > 1 ? "SUBCOMMAND"
                                                                                                        : "SUBCOMMANDS")
            << (app->get_require_subcommand_min() == 0 ? "]" : "");
    }

    out << std::endl;

    return out.str();
}